

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::js::Generator::FindProvidesForMessage
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *provided)

{
  Printer *printer_00;
  Printer *extraout_RDX;
  long lVar1;
  Printer *printer_01;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  long lVar2;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar3;
  string name;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (*(char *)(*(long *)(desc + 0x20) + 0x4b) == '\0') {
    printer_01 = (Printer *)local_50;
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              ((string *)printer_01,
               (_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
               (GeneratorOptions *)(options->namespace_prefix)._M_string_length,desc);
    this_00 = provided;
    pVar3 = std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)provided,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       printer_01);
    printer_00 = pVar3._8_8_;
    if (0 < *(int *)(desc + 0x74)) {
      lVar1 = 0;
      lVar2 = 0;
      do {
        printer_01 = (Printer *)options;
        FindProvidesForEnum((Generator *)this_00,options,printer_00,
                            (EnumDescriptor *)(*(long *)(desc + 0x40) + lVar1),provided);
        lVar2 = lVar2 + 1;
        lVar1 = lVar1 + 0x48;
        printer_00 = extraout_RDX;
      } while (lVar2 < *(int *)(desc + 0x74));
    }
    FindProvidesForOneOfEnums(options,printer_01,desc,provided);
    if (0 < *(int *)(desc + 0x70)) {
      lVar1 = 0;
      lVar2 = 0;
      do {
        FindProvidesForMessage
                  (this,options,printer,(Descriptor *)(*(long *)(desc + 0x38) + lVar1),provided);
        lVar2 = lVar2 + 1;
        lVar1 = lVar1 + 0x88;
      } while (lVar2 < *(int *)(desc + 0x70));
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  return;
}

Assistant:

void Generator::FindProvidesForMessage(const GeneratorOptions& options,
                                       io::Printer* printer,
                                       const Descriptor* desc,
                                       std::set<std::string>* provided) const {
  if (IgnoreMessage(desc)) {
    return;
  }

  std::string name = GetMessagePath(options, desc);
  provided->insert(name);

  for (int i = 0; i < desc->enum_type_count(); i++) {
    FindProvidesForEnum(options, printer, desc->enum_type(i), provided);
  }

  FindProvidesForOneOfEnums(options, printer, desc, provided);

  for (int i = 0; i < desc->nested_type_count(); i++) {
    FindProvidesForMessage(options, printer, desc->nested_type(i), provided);
  }
}